

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VmConstant * CreateConstantInt(Allocator *allocator,SynBase *source,int value)

{
  int iVar1;
  undefined4 extraout_var;
  VmConstant *this;
  
  iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
  this = (VmConstant *)CONCAT44(extraout_var,iVar1);
  VmConstant::VmConstant(this,allocator,(VmType)ZEXT816((ulong)0x400000001),source);
  this->iValue = value;
  return this;
}

Assistant:

VmConstant* CreateConstantInt(Allocator *allocator, SynBase *source, int value)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Int, source);

	result->iValue = value;

	return result;
}